

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

void gen_VMLA_sp(TCGContext_conflict1 *tcg_ctx,TCGv_i32 vd,TCGv_i32 vn,TCGv_i32 vm,TCGv_ptr fpst)

{
  TCGv_i32 retval;
  uintptr_t o;
  
  retval = tcg_temp_new_i32(tcg_ctx);
  gen_helper_vfp_muls(tcg_ctx,retval,vn,vm,fpst);
  gen_helper_vfp_adds(tcg_ctx,vd,vd,retval,fpst);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(retval + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_VMLA_sp(TCGContext *tcg_ctx, TCGv_i32 vd, TCGv_i32 vn, TCGv_i32 vm, TCGv_ptr fpst)
{
    /* Note that order of inputs to the add matters for NaNs */
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);

    gen_helper_vfp_muls(tcg_ctx, tmp, vn, vm, fpst);
    gen_helper_vfp_adds(tcg_ctx, vd, vd, tmp, fpst);
    tcg_temp_free_i32(tcg_ctx, tmp);
}